

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileInstaller.cxx
# Opt level: O1

bool __thiscall cmFileInstaller::CheckKeyword(cmFileInstaller *this,string *arg)

{
  cmExecutionStatus *pcVar1;
  bool bVar2;
  int iVar3;
  ostream *poVar4;
  ostringstream e;
  long *local_1b0;
  long local_1a0 [2];
  undefined1 local_190 [376];
  
  iVar3 = std::__cxx11::string::compare((char *)arg);
  if (iVar3 == 0) {
    if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
      (this->super_cmFileCopier).Doing = 10;
      return true;
    }
  }
  else {
    iVar3 = std::__cxx11::string::compare((char *)arg);
    if (iVar3 == 0) {
      if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
        (this->super_cmFileCopier).Doing = 4;
        return true;
      }
    }
    else {
      iVar3 = std::__cxx11::string::compare((char *)arg);
      if (iVar3 == 0) {
        if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
          (this->super_cmFileCopier).Doing = 0xb;
          return true;
        }
      }
      else {
        iVar3 = std::__cxx11::string::compare((char *)arg);
        if (iVar3 == 0) {
          if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
            (this->super_cmFileCopier).Doing = 0;
            this->Optional = true;
            return true;
          }
        }
        else {
          iVar3 = std::__cxx11::string::compare((char *)arg);
          if (iVar3 == 0) {
            if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
              (this->super_cmFileCopier).Doing = 0;
              this->MessageAlways = true;
              return true;
            }
          }
          else {
            iVar3 = std::__cxx11::string::compare((char *)arg);
            if (iVar3 == 0) {
              if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                (this->super_cmFileCopier).Doing = 0;
                this->MessageLazy = true;
                return true;
              }
            }
            else {
              iVar3 = std::__cxx11::string::compare((char *)arg);
              if (iVar3 == 0) {
                if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                  (this->super_cmFileCopier).Doing = 0;
                  this->MessageNever = true;
                  return true;
                }
              }
              else {
                iVar3 = std::__cxx11::string::compare((char *)arg);
                if (iVar3 == 0) {
                  if ((this->super_cmFileCopier).CurrentMatchRule != (MatchRule *)0x0) {
                    (this->super_cmFileCopier).Doing = 9;
                    return true;
                  }
                  (this->super_cmFileCopier).Doing = 7;
                  (this->super_cmFileCopier).UseGivenPermissionsFile = true;
                  return true;
                }
                iVar3 = std::__cxx11::string::compare((char *)arg);
                if (iVar3 != 0) {
                  iVar3 = std::__cxx11::string::compare((char *)arg);
                  if (((iVar3 != 0) &&
                      (iVar3 = std::__cxx11::string::compare((char *)arg), iVar3 != 0)) &&
                     (iVar3 = std::__cxx11::string::compare((char *)arg), iVar3 != 0)) {
                    bVar2 = cmFileCopier::CheckKeyword(&this->super_cmFileCopier,arg);
                    return bVar2;
                  }
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)local_190,"INSTALL called with old-style ",0x1e);
                  poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                                     ((ostream *)local_190,(arg->_M_dataplus)._M_p,
                                      arg->_M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>(poVar4," argument.  ",0xc);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar4,"This script was generated with an older version of CMake.  ",
                             0x3b);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar4,"Re-run this cmake version on your build tree.",0x2d);
                  pcVar1 = (this->super_cmFileCopier).Status;
                  std::__cxx11::stringbuf::str();
                  std::__cxx11::string::_M_assign((string *)&pcVar1->Error);
                  if (local_1b0 != local_1a0) {
                    operator_delete(local_1b0,local_1a0[0] + 1);
                  }
                  (this->super_cmFileCopier).Doing = 1;
                  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
                  std::ios_base::~ios_base((ios_base *)(local_190 + 0x70));
                  return true;
                }
                if ((this->super_cmFileCopier).CurrentMatchRule == (MatchRule *)0x0) {
                  (this->super_cmFileCopier).Doing = 8;
                  (this->super_cmFileCopier).UseGivenPermissionsDir = true;
                  return true;
                }
              }
            }
          }
        }
      }
    }
  }
  cmFileCopier::NotAfterMatch(&this->super_cmFileCopier,arg);
  return true;
}

Assistant:

bool cmFileInstaller::CheckKeyword(std::string const& arg)
{
  if (arg == "TYPE") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingType;
    }
  } else if (arg == "FILES") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingFiles;
    }
  } else if (arg == "RENAME") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingRename;
    }
  } else if (arg == "OPTIONAL") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->Optional = true;
    }
  } else if (arg == "MESSAGE_ALWAYS") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->MessageAlways = true;
    }
  } else if (arg == "MESSAGE_LAZY") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->MessageLazy = true;
    }
  } else if (arg == "MESSAGE_NEVER") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      this->Doing = DoingNone;
      this->MessageNever = true;
    }
  } else if (arg == "PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->Doing = DoingPermissionsMatch;
    } else {
      // file(INSTALL) aliases PERMISSIONS to FILE_PERMISSIONS
      this->Doing = DoingPermissionsFile;
      this->UseGivenPermissionsFile = true;
    }
  } else if (arg == "DIR_PERMISSIONS") {
    if (this->CurrentMatchRule) {
      this->NotAfterMatch(arg);
    } else {
      // file(INSTALL) aliases DIR_PERMISSIONS to DIRECTORY_PERMISSIONS
      this->Doing = DoingPermissionsDir;
      this->UseGivenPermissionsDir = true;
    }
  } else if (arg == "COMPONENTS" || arg == "CONFIGURATIONS" ||
             arg == "PROPERTIES") {
    std::ostringstream e;
    e << "INSTALL called with old-style " << arg << " argument.  "
      << "This script was generated with an older version of CMake.  "
      << "Re-run this cmake version on your build tree.";
    this->Status.SetError(e.str());
    this->Doing = DoingError;
  } else {
    return this->cmFileCopier::CheckKeyword(arg);
  }
  return true;
}